

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O0

void __thiscall kratos::PassManager::run_passes(PassManager *this,Generator *generator)

{
  bool bVar1;
  int iVar2;
  _Setw _Var3;
  reference __k;
  mapped_type *__x;
  ostream *poVar4;
  duration<long,_std::ratio<1L,_1000L>_> local_c0;
  rep local_b8;
  rep time;
  type diff;
  time_point end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_90;
  time_point start;
  mapped_type fn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fn_name_1;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fn_name;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int string_size;
  Generator *generator_local;
  PassManager *this_local;
  
  __range2._4_4_ = 0;
  if (((byte)this[0x48] & 1) != 0) {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(this + 0x30));
    fn_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(this + 0x30));
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&fn_name), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&__end2);
      iVar2 = std::__cxx11::string::size();
      if (__range2._4_4_ < iVar2) {
        __range2._4_4_ = iVar2;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(this + 0x30));
  fn_name_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(this + 0x30));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&fn_name_1), bVar1) {
    __k = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
    __x = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
          ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
                *)this,__k);
    std::function<void_(kratos::Generator_*)>::function
              ((function<void_(kratos::Generator_*)> *)&start,__x);
    local_90.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    std::function<void_(kratos::Generator_*)>::operator()
              ((function<void_(kratos::Generator_*)> *)&start,generator);
    if (((byte)this[0x48] & 1) != 0) {
      diff.__r = std::chrono::_V2::system_clock::now();
      time = (rep)std::chrono::operator-
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&diff,&local_90);
      local_c0.__r = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&time);
      local_b8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_c0);
      poVar4 = std::operator<<((ostream *)&std::cout,"[name]: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
      _Var3 = std::setw(__range2._4_4_);
      poVar4 = std::operator<<(poVar4,_Var3);
      poVar4 = std::operator<<(poVar4,(string *)__k);
      poVar4 = std::operator<<(poVar4,"\t[time]: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_b8);
      poVar4 = std::operator<<(poVar4," ms");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::function<void_(kratos::Generator_*)>::~function
              ((function<void_(kratos::Generator_*)> *)&start);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void PassManager::run_passes(Generator* generator) {
    // compute padding
    int string_size = 0;
    if (collect_perf_) {
        for (auto const& fn_name : passes_order_) {
            auto s = static_cast<int>(fn_name.size());
            if (s > string_size) {
                string_size = s;
            }
        }
    }

    for (const auto& fn_name : passes_order_) {
        auto fn = passes_.at(fn_name);
        auto start = std::chrono::system_clock::now();
        fn(generator);

        if (collect_perf_) {
            auto end = std::chrono::system_clock::now();
            auto diff = end - start;
            auto time = std::chrono::duration_cast<std::chrono::milliseconds>(diff).count();
            std::cout << "[name]: " << std::left << std::setw(string_size) << fn_name
                      << "\t[time]: " << time << " ms" << std::endl;
        }
    }
}